

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_mdl.h
# Opt level: O2

void __thiscall
ExampleModel::
WriteConExpr<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::ExprArgWriter>
          (ExampleModel *this,int i,ExprArgWriter *ew)

{
  ExprArgWriter ew010101;
  ExprArgWriter ew0101;
  ExprArgWriter ew01020101;
  ExprArgWriter ew01;
  
  if (i != 2) {
    if (i == 1) {
      mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
      OPut2(&ew01,(int)ew,(char *)0x0);
      mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
      OPut2(&ew0101,(int)&ew01,(char *)0x2);
      mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::NPut
                (&ew0101,-38.2);
      mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
      OPut2(&ew010101,(int)&ew0101,(char *)0x5);
      mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::VPut
                (&ew010101,0,"y");
      mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::NPut
                (&ew010101,2.0);
      mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
      OPut2(&ew0101,(int)&ew01,(char *)0x2);
      mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
      OPut2(&ew010101,(int)&ew0101,(char *)0x2);
      mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::NPut
                (&ew010101,109.0);
      mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
      OPut1(&ew01020101,(int)&ew010101,(char *)0x29);
      mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::VPut
                (&ew01020101,3,"t2");
      mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
      OPut2(&ew010101,(int)&ew0101,(char *)0x0);
      mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::VPut
                (&ew010101,5,"t1");
      mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
      OPut2(&ew01020101,(int)&ew010101,(char *)0x5);
      mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::VPut
                (&ew01020101,4,"t3");
      mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::NPut
                (&ew01020101,1.5);
    }
    else if (i == 0) {
      mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
      OPut2(&ew01,(int)ew,(char *)0x2);
      mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::NPut
                (&ew01,5.0);
      mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
      OPut2(&ew0101,(int)&ew01,(char *)0x5);
      mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::VPut
                (&ew0101,3,"t2");
      mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::NPut
                (&ew0101,2.0);
    }
    return;
  }
  mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::NPut
            (ew,0.0);
  return;
}

Assistant:

void WriteConExpr(int i, EWriter& ew) const {
    using namespace mp::nl;
    switch (i) {
    case 0:                  // C1_t2
    {
      auto ew01 = ew.OPut2(MUL);
      ew01.NPut(5);
      {
        auto ew0101 = ew01.OPut2(POW);
        ew0101.VPut(3, "t2");
        ew0101.NPut(2);
      }
    } break;
    case 1:                  // C2_t1t2t3
    {
      auto ew01 = ew.OPut2(ADD);
      {
        auto ew0101 = ew01.OPut2(MUL);
        ew0101.NPut(-38.2);
        {
          auto ew010101 = ew0101.OPut2(POW);
          ew010101.VPut(0, "y");
          ew010101.NPut(2);
        }
      }
      {
        auto ew0102 = ew01.OPut2(MUL);
        {
          auto ew010201 = ew0102.OPut2(MUL);
          ew010201.NPut(109);
          {
            auto ew01020101 = ew010201.OPut1(SIN);
            ew01020101.VPut(3, "t2");
          }
        }
        {
          auto ew010202 = ew0102.OPut2(ADD.code, ADD.name);
          ew010202.VPut(5, "t1");
          {
            auto ew01020201 = ew010202.OPut2(POW);
            ew01020201.VPut(4, "t3");
            ew01020201.NPut(1.5);
          }
        }
      }
    } break;
    case 2:                  // C0_lin
      ew.NPut(0);            // no non-linear part
      break;
    default:
      assert(false);
    {}
    }
  }